

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_serialiserscommon.cpp
# Opt level: O0

void __thiscall
tst_SerialiserCommon::insertBranch
          (tst_SerialiserCommon *this,QAbstractItemModel *model,QModelIndex *parent,bool multiRoles,
          int subBranches)

{
  byte bVar1;
  bool bVar2;
  result_type_conflict rVar3;
  int iVar4;
  int iVar5;
  QVariant local_298;
  QVariant local_278;
  QVariant local_258;
  QVariant local_238;
  QLatin1Char local_213;
  QChar local_212;
  QLatin1Char local_20f;
  QChar local_20e;
  QLatin1Char local_20b;
  QChar local_20a;
  QArrayDataPointer<char16_t> local_208;
  QString local_1f0;
  QString local_1d8;
  QString local_1c0;
  QString local_1a8;
  QString local_190;
  QVariant local_178;
  undefined1 local_158 [8];
  QModelIndex idx;
  int local_138;
  int j;
  int i;
  QString local_118;
  byte local_fd;
  byte local_e9;
  QVariant local_e8;
  QString local_c8;
  undefined1 local_b0 [8];
  QString baseString;
  bool valueOfExpression_1;
  bool valueOfExpression;
  uniform_int_distribution<int> rowsDist;
  uniform_int_distribution<int> coulmnsDist;
  uniform_int_distribution<int> colorDistribution;
  int randomBrushes [6];
  int subBranches_local;
  bool multiRoles_local;
  QModelIndex *parent_local;
  QAbstractItemModel *model_local;
  tst_SerialiserCommon *this_local;
  char16_t *str;
  char16_t *str_1;
  
  std::uniform_int_distribution<int>::uniform_int_distribution(&coulmnsDist,0,5);
  std::uniform_int_distribution<int>::uniform_int_distribution(&rowsDist,2,5);
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)&stack0xffffffffffffff70,3,6);
  rVar3 = std::uniform_int_distribution<int>::operator()(&rowsDist,&this->generator);
  bVar1 = (**(code **)(*(long *)model + 0x100))(model,0,rVar3,parent);
  baseString.d.size._7_1_ = bVar1 & 1;
  rVar3 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&stack0xffffffffffffff70,&this->generator);
  bVar1 = (**(code **)(*(long *)model + 0xf8))(model,0,rVar3,parent);
  baseString.d.size._6_1_ = bVar1 & 1;
  bVar2 = QModelIndex::isValid(parent);
  local_e9 = 0;
  local_fd = 0;
  if (bVar2) {
    QModelIndex::data(&local_e8,parent,2);
    local_e9 = 1;
    QVariant::toString();
    local_fd = 1;
    QArrayDataPointer<char16_t>::QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&i,(Data *)0x0,L"->",2);
    QString::QString(&local_118,(DataPointer *)&i);
    operator+((QString *)local_b0,&local_c8,&local_118);
    QString::~QString(&local_118);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&i);
  }
  else {
    QString::QString((QString *)local_b0);
  }
  if ((local_fd & 1) != 0) {
    QString::~QString(&local_c8);
  }
  if ((local_e9 & 1) != 0) {
    QVariant::~QVariant(&local_e8);
  }
  for (local_138 = 0; iVar4 = (**(code **)(*(long *)model + 0x78))(model,parent), local_138 < iVar4;
      local_138 = local_138 + 1) {
    for (idx.m._4_4_ = 0; iVar4 = idx.m._4_4_,
        iVar5 = (**(code **)(*(long *)model + 0x80))(model,parent), iVar4 < iVar5;
        idx.m._4_4_ = idx.m._4_4_ + 1) {
      (**(code **)(*(long *)model + 0x60))(local_158,model,local_138,idx.m._4_4_,parent);
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_208,(Data *)0x0,L"%1,%2[%3]",9);
      QString::QString(&local_1f0,&local_208);
      QLatin1Char::QLatin1Char(&local_20b,' ');
      QChar::QChar(&local_20a,local_20b);
      QString::arg(&local_1d8,&local_1f0,local_138,0,10,local_20a);
      iVar4 = idx.m._4_4_;
      QLatin1Char::QLatin1Char(&local_20f,' ');
      QChar::QChar(&local_20e,local_20f);
      QString::arg(&local_1c0,&local_1d8,iVar4,0,10,local_20e);
      rVar3 = std::uniform_int_distribution<int>::operator()(&coulmnsDist,&this->generator);
      QLatin1Char::QLatin1Char(&local_213,' ');
      QChar::QChar(&local_212,local_213);
      QString::arg(&local_1a8,&local_1c0,rVar3,0,10,local_212);
      operator+(&local_190,(QString *)local_b0,&local_1a8);
      QVariant::QVariant(&local_178,(QString *)&local_190);
      (**(code **)(*(long *)model + 0x98))(model,local_158,&local_178,2);
      QVariant::~QVariant(&local_178);
      QString::~QString(&local_190);
      QString::~QString(&local_1a8);
      QString::~QString(&local_1c0);
      QString::~QString(&local_1d8);
      QString::~QString(&local_1f0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
      if (multiRoles) {
        rVar3 = std::uniform_int_distribution<int>::operator()(&coulmnsDist,&this->generator);
        QVariant::QVariant(&local_238,randomBrushes[(long)rVar3 + -2]);
        (**(code **)(*(long *)model + 0x98))(model,local_158,&local_238,8);
        QVariant::~QVariant(&local_238);
        rVar3 = std::uniform_int_distribution<int>::operator()(&coulmnsDist,&this->generator);
        QVariant::QVariant(&local_258,randomBrushes[(long)rVar3 + -2]);
        (**(code **)(*(long *)model + 0x98))(model,local_158,&local_258,9);
        QVariant::~QVariant(&local_258);
        QVariant::QVariant(&local_278,local_138);
        (**(code **)(*(long *)model + 0x98))(model,local_158,&local_278,0x100);
        QVariant::~QVariant(&local_278);
        QVariant::QVariant(&local_298,idx.m._4_4_);
        (**(code **)(*(long *)model + 0x98))(model,local_158,&local_298,0x101);
        QVariant::~QVariant(&local_298);
      }
      if (0 < subBranches) {
        insertBranch(this,model,(QModelIndex *)local_158,multiRoles,subBranches + -1);
      }
    }
  }
  QString::~QString((QString *)local_b0);
  return;
}

Assistant:

void tst_SerialiserCommon::insertBranch(QAbstractItemModel *model, const QModelIndex &parent, bool multiRoles, int subBranches)
{
    Q_ASSERT(model);
    Q_ASSERT(!parent.isValid() || parent.model() == model);
    const int randomBrushes[] = {Qt::red, Qt::blue, Qt::green, Qt::yellow, Qt::magenta, Qt::cyan};
    std::uniform_int_distribution<int> colorDistribution(0, (sizeof(randomBrushes) / sizeof(randomBrushes[0])) - 1);
    std::uniform_int_distribution<int> coulmnsDist(2, 5);
    std::uniform_int_distribution<int> rowsDist(3, 6);
    Q_ASSUME(model->insertColumns(0, coulmnsDist(generator), parent));
    Q_ASSUME(model->insertRows(0, rowsDist(generator), parent));
    const QString baseString = parent.isValid() ? (parent.data(Qt::EditRole).toString() + QStringLiteral("->")) : QString();
    for (int i = 0; i < model->rowCount(parent); ++i) {
        for (int j = 0; j < model->columnCount(parent); ++j) {
            const QModelIndex idx = model->index(i, j, parent);
            model->setData(idx, baseString + QStringLiteral("%1,%2[%3]").arg(i).arg(j).arg(colorDistribution(generator)), Qt::EditRole);
            if (multiRoles) {
                model->setData(idx, randomBrushes[colorDistribution(generator)], Qt::BackgroundRole);
                model->setData(idx, randomBrushes[colorDistribution(generator)], Qt::ForegroundRole);
                model->setData(idx, i, Qt::UserRole);
                model->setData(idx, j, Qt::UserRole + 1);
            }
            if (subBranches > 0)
                insertBranch(model, idx, multiRoles, subBranches - 1);
        }
    }
}